

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cc
# Opt level: O2

string * __thiscall
tvm::runtime::ModuleNode::GetSource(string *__return_storage_ptr__,ModuleNode *this,string *format)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  LogMessageFatal local_1a0;
  
  dmlc::LogMessageFatal::LogMessageFatal
            (&local_1a0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/module.cc"
             ,0x62);
  poVar2 = std::operator<<((ostream *)&local_1a0,"Module[");
  iVar1 = (*this->_vptr_ModuleNode[2])(this);
  poVar2 = std::operator<<(poVar2,(char *)CONCAT44(extraout_var,iVar1));
  std::operator<<(poVar2,"] does not support GetSource");
  dmlc::LogMessageFatal::~LogMessageFatal(&local_1a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string ModuleNode::GetSource(const std::string &format) {
  LOG(FATAL) << "Module[" << type_key() << "] does not support GetSource";
  return "";
}